

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

string_view __thiscall
google::protobuf::Reflection::GetStringViewImpl
          (Reflection *this,Message *message,FieldDescriptor *field,ScratchSpace *scratch)

{
  bool bVar1;
  int number;
  CppStringType CVar2;
  ExtensionSet *this_00;
  Cord **ppCVar3;
  LogMessage *pLVar4;
  ArenaStringPtr *pAVar5;
  string *psVar6;
  Cord *local_98;
  TaggedStringPtr local_78;
  ArenaStringPtr str;
  LogMessage local_58;
  Voidify local_41;
  Cord *local_40;
  Cord *cord;
  ScratchSpace *scratch_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  cord = (Cord *)scratch;
  scratch_local = (ScratchSpace *)field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = GetExtensionSet(this,(Message *)field_local);
    number = FieldDescriptor::number((FieldDescriptor *)scratch_local);
    psVar6 = internal::DefaultValueStringAsString_abi_cxx11_((FieldDescriptor *)scratch_local);
    psVar6 = internal::ExtensionSet::GetString(this_00,number,psVar6);
    _this_local = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
  }
  else {
    bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,(FieldDescriptor *)scratch_local)
    ;
    if ((!bVar1) ||
       (bVar1 = HasOneofField(this,(Message *)field_local,(FieldDescriptor *)scratch_local), bVar1))
    {
      CVar2 = FieldDescriptor::cpp_string_type((FieldDescriptor *)scratch_local);
      if (CVar2 == kCord) {
        bVar1 = internal::ReflectionSchema::InRealOneof
                          (&this->schema_,(FieldDescriptor *)scratch_local);
        if (bVar1) {
          ppCVar3 = GetField<absl::lts_20250127::Cord*>
                              (this,(Message *)field_local,(FieldDescriptor *)scratch_local);
          local_98 = *ppCVar3;
        }
        else {
          local_98 = GetField<absl::lts_20250127::Cord>
                               (this,(Message *)field_local,(FieldDescriptor *)scratch_local);
        }
        local_40 = local_98;
        if (cord == (Cord *)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_58,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                     ,0x7e7,"scratch");
          pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar4);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_58);
        }
        _this_local = ScratchSpace::CopyFromCord((ScratchSpace *)cord,local_98);
      }
      else {
        pAVar5 = GetField<google::protobuf::internal::ArenaStringPtr>
                           (this,(Message *)field_local,(FieldDescriptor *)scratch_local);
        local_78.ptr_ = (pAVar5->tagged_ptr_).ptr_;
        bVar1 = internal::ArenaStringPtr::IsDefault((ArenaStringPtr *)&local_78);
        if (bVar1) {
          _this_local = FieldDescriptor::default_value_string((FieldDescriptor *)scratch_local);
        }
        else {
          psVar6 = internal::ArenaStringPtr::Get_abi_cxx11_((ArenaStringPtr *)&local_78);
          _this_local = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
        }
      }
    }
    else {
      _this_local = FieldDescriptor::default_value_string((FieldDescriptor *)scratch_local);
    }
  }
  return _this_local;
}

Assistant:

absl::string_view Reflection::GetStringViewImpl(const Message& message,
                                                const FieldDescriptor* field,
                                                ScratchSpace* scratch) const {
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(
        field->number(), internal::DefaultValueStringAsString(field));
  }
  if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
    return field->default_value_string();
  }

  switch (field->cpp_string_type()) {
    case FieldDescriptor::CppStringType::kCord: {
      const auto& cord = schema_.InRealOneof(field)
                             ? *GetField<absl::Cord*>(message, field)
                             : GetField<absl::Cord>(message, field);
      ABSL_DCHECK(scratch);
      return scratch->CopyFromCord(cord);
    }
    default:
      auto str = GetField<ArenaStringPtr>(message, field);
      return str.IsDefault() ? field->default_value_string() : str.Get();
  }
}